

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalTranslator.cpp
# Opt level: O0

void __thiscall UnitTest::SignalTranslator::SignalTranslator(SignalTranslator *this)

{
  undefined1 local_a8 [8];
  sigaction action;
  SignalTranslator *this_local;
  
  this->m_oldJumpTarget = s_jumpTarget->m_currentJumpTarget;
  action.sa_mask.__val[0xf]._0_4_ = 0;
  local_a8 = (undefined1  [8])anon_unknown_1::SignalHandler;
  s_jumpTarget = this;
  action.sa_restorer = (_func_void *)this;
  sigemptyset((sigset_t *)&action);
  sigaction(0xb,(sigaction *)local_a8,(sigaction *)&this->m_old_SIGSEGV_action);
  sigaction(8,(sigaction *)local_a8,(sigaction *)&this->m_old_SIGFPE_action);
  sigaction(5,(sigaction *)local_a8,(sigaction *)&this->m_old_SIGTRAP_action);
  sigaction(7,(sigaction *)local_a8,(sigaction *)&this->m_old_SIGBUS_action);
  sigaction(4,(sigaction *)local_a8,(sigaction *)&this->m_old_SIGBUS_action);
  return;
}

Assistant:

SignalTranslator::SignalTranslator()
{
    m_oldJumpTarget = s_jumpTarget;
    s_jumpTarget = &m_currentJumpTarget;

    struct sigaction action;
    action.sa_flags = 0;
    action.sa_handler = SignalHandler;
    sigemptyset( &action.sa_mask );

    sigaction( SIGSEGV, &action, &m_old_SIGSEGV_action );
    sigaction( SIGFPE , &action, &m_old_SIGFPE_action  );
    sigaction( SIGTRAP, &action, &m_old_SIGTRAP_action );
    sigaction( SIGBUS , &action, &m_old_SIGBUS_action  );
    sigaction( SIGILL , &action, &m_old_SIGBUS_action  );
}